

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1b21075::PeerManagerImpl::ProcessGetCFHeaders
          (PeerManagerImpl *this,CNode *node,Peer *peer,DataStream *vRecv)

{
  long lVar1;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  bool bVar2;
  undefined1 uVar3;
  CBlockIndex *this_00;
  vector<uint256,_std::allocator<uint256>_> *in_RCX;
  char *in_RDX;
  allocator<char> *in_RSI;
  long in_FS_OFFSET;
  CBlockIndex *prev_block;
  BlockFilterType filter_type;
  vector<uint256,_std::allocator<uint256>_> filter_hashes;
  BlockFilterIndex *filter_index;
  CBlockIndex *stop_index;
  uint32_t start_height;
  uint8_t filter_type_ser;
  uint256 prev_header;
  uint256 stop_hash;
  uint256 *in_stack_fffffffffffffdb8;
  undefined4 uVar6;
  uint256 *puVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  uint256 *in_stack_fffffffffffffdc0;
  base_blob<256U> *this_01;
  DataStream *in_stack_fffffffffffffdc8;
  char *in_stack_fffffffffffffdd0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffdd8;
  CBlockIndex *in_stack_fffffffffffffde0;
  uint256 *in_stack_fffffffffffffde8;
  vector<uint256,_std::allocator<uint256>_> *in_stack_fffffffffffffe00;
  string *msg_type;
  CNode *in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe14;
  uint256 *in_stack_fffffffffffffe18;
  BlockFilterIndex *this_02;
  undefined7 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe27;
  BlockFilterIndex *in_stack_fffffffffffffe28;
  int iVar7;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  undefined8 in_stack_fffffffffffffe50;
  BlockFilterType filter_type_00;
  Peer *in_stack_fffffffffffffe58;
  CNode *in_stack_fffffffffffffe60;
  ConstevalFormatString<3U> in_stack_fffffffffffffe68;
  char *fmt;
  CBlockIndex *in_stack_fffffffffffffe70;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 uVar8;
  string local_159;
  undefined1 local_138 [72];
  int local_f0;
  undefined1 local_e9;
  uint256 local_e8;
  uint32_t in_stack_ffffffffffffff54;
  Level in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  _Head_base<0UL,_BaseIndex::DB_*,_false> in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  
  filter_type_00 = (BlockFilterType)((ulong)in_stack_fffffffffffffe50 >> 0x38);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uint256::uint256(in_stack_fffffffffffffdb8);
  uVar6 = (undefined4)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
  DataStream::operator>>(in_stack_fffffffffffffdc8,(uchar *)in_stack_fffffffffffffdc0);
  DataStream::operator>>(in_stack_fffffffffffffdc8,(uint *)in_stack_fffffffffffffdc0);
  DataStream::operator>>(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
  this_01 = (base_blob<256U> *)(local_138 + 0x40);
  this_00 = (CBlockIndex *)(local_138 + 0x38);
  puVar4 = (uint256 *)CONCAT44(uVar6,2000);
  bVar2 = PrepareBlockFilterRequest
                    ((PeerManagerImpl *)in_stack_fffffffffffffe68.fmt,in_stack_fffffffffffffe60,
                     in_stack_fffffffffffffe58,filter_type_00,in_stack_ffffffffffffff54,
                     (uint256 *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                     in_stack_ffffffffffffffa0,(CBlockIndex **)in_stack_ffffffffffffffa8,
                     (BlockFilterIndex **)in_stack_ffffffffffffffb0);
  if (bVar2) {
    uint256::uint256(puVar4);
    uVar8 = local_e9;
    if (local_f0 != 0) {
      in_stack_fffffffffffffe70 =
           CBlockIndex::GetAncestor
                     (in_stack_fffffffffffffde0,(int)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
      bVar2 = BlockFilterIndex::LookupFilterHeader
                        (in_stack_fffffffffffffe28,
                         (CBlockIndex *)
                         CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                         in_stack_fffffffffffffe18);
      uVar8 = local_e9;
      if (!bVar2) {
        bVar2 = ::LogAcceptCategory((LogFlags)puVar4,Trace);
        uVar6 = (undefined4)((ulong)puVar4 >> 0x20);
        if (bVar2) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
          fmt = "Failed to find block filter header in index: filter_type=%s, block_hash=%s\n";
          BlockFilterTypeName_abi_cxx11_
                    ((BlockFilterType)((ulong)in_stack_fffffffffffffdd8 >> 0x38));
          iVar7 = (int)((ulong)&stack0xffffffffffffff78 >> 0x20);
          CBlockIndex::GetBlockHash(this_00);
          base_blob<256u>::ToString_abi_cxx11_(this_01);
          pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(uVar6,1);
          logging_function._M_str = in_RDX;
          logging_function._M_len = (size_t)in_RCX;
          source_file._M_str._0_7_ = in_stack_fffffffffffffe78;
          source_file._M_len = (size_t)in_stack_fffffffffffffe70;
          source_file._M_str._7_1_ = local_e9;
          LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                    (logging_function,source_file,iVar7,
                     CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                     in_stack_ffffffffffffff60,(ConstevalFormatString<2U>)fmt,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffff70,in_stack_ffffffffffffff78);
          std::__cxx11::string::~string(pbVar5);
        }
        goto LAB_01092613;
      }
    }
    iVar7 = (int)((ulong)in_stack_fffffffffffffe28 >> 0x20);
    this_02 = (BlockFilterIndex *)local_138;
    std::vector<uint256,_std::allocator<uint256>_>::vector
              ((vector<uint256,_std::allocator<uint256>_> *)puVar4);
    uVar3 = BlockFilterIndex::LookupFilterHashRange
                      (this_02,in_stack_fffffffffffffe14,(CBlockIndex *)in_stack_fffffffffffffe08,
                       in_stack_fffffffffffffe00);
    if ((bool)uVar3) {
      msg_type = &local_159;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe08,(char *)msg_type,in_RSI);
      puVar4 = &local_e8;
      CBlockIndex::GetBlockHash(this_00);
      pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138;
      ::(anonymous_namespace)::PeerManagerImpl::
      MakeAndPushMessage<unsigned_char&,uint256,uint256&,std::vector<uint256,std::allocator<uint256>>&>
                ((PeerManagerImpl *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                 in_stack_fffffffffffffe08,msg_type,(uchar *)in_RSI,puVar4,in_stack_fffffffffffffde8
                 ,in_RCX);
      std::__cxx11::string::~string(pbVar5);
      std::allocator<char>::~allocator((allocator<char> *)&local_159);
    }
    else {
      bVar2 = ::LogAcceptCategory((LogFlags)puVar4,Trace);
      uVar6 = (undefined4)((ulong)puVar4 >> 0x20);
      if (bVar2) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
        this_00 = (CBlockIndex *)
                  BlockFilterTypeName_abi_cxx11_
                            ((BlockFilterType)((ulong)in_stack_fffffffffffffdd8 >> 0x38));
        base_blob<256u>::ToString_abi_cxx11_(this_01);
        pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uVar6,1);
        logging_function_00._M_str = in_RDX;
        logging_function_00._M_len = (size_t)in_RCX;
        source_file_00._M_str._0_7_ = in_stack_fffffffffffffe78;
        source_file_00._M_len = (size_t)in_stack_fffffffffffffe70;
        source_file_00._M_str._7_1_ = uVar8;
        LogPrintFormatInternal<std::__cxx11::string,unsigned_int,std::__cxx11::string>
                  (logging_function_00,source_file_00,iVar7,
                   CONCAT17(uVar3,in_stack_fffffffffffffe20),in_stack_ffffffffffffff60,
                   in_stack_fffffffffffffe68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff70,(uint *)in_stack_ffffffffffffff78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff80._M_head_impl);
        std::__cxx11::string::~string(pbVar5);
      }
    }
    std::vector<uint256,_std::allocator<uint256>_>::~vector
              ((vector<uint256,_std::allocator<uint256>_> *)this_00);
  }
LAB_01092613:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PeerManagerImpl::ProcessGetCFHeaders(CNode& node, Peer& peer, DataStream& vRecv)
{
    uint8_t filter_type_ser;
    uint32_t start_height;
    uint256 stop_hash;

    vRecv >> filter_type_ser >> start_height >> stop_hash;

    const BlockFilterType filter_type = static_cast<BlockFilterType>(filter_type_ser);

    const CBlockIndex* stop_index;
    BlockFilterIndex* filter_index;
    if (!PrepareBlockFilterRequest(node, peer, filter_type, start_height, stop_hash,
                                   MAX_GETCFHEADERS_SIZE, stop_index, filter_index)) {
        return;
    }

    uint256 prev_header;
    if (start_height > 0) {
        const CBlockIndex* const prev_block =
            stop_index->GetAncestor(static_cast<int>(start_height - 1));
        if (!filter_index->LookupFilterHeader(prev_block, prev_header)) {
            LogDebug(BCLog::NET, "Failed to find block filter header in index: filter_type=%s, block_hash=%s\n",
                         BlockFilterTypeName(filter_type), prev_block->GetBlockHash().ToString());
            return;
        }
    }

    std::vector<uint256> filter_hashes;
    if (!filter_index->LookupFilterHashRange(start_height, stop_index, filter_hashes)) {
        LogDebug(BCLog::NET, "Failed to find block filter hashes in index: filter_type=%s, start_height=%d, stop_hash=%s\n",
                     BlockFilterTypeName(filter_type), start_height, stop_hash.ToString());
        return;
    }

    MakeAndPushMessage(node, NetMsgType::CFHEADERS,
              filter_type_ser,
              stop_index->GetBlockHash(),
              prev_header,
              filter_hashes);
}